

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPlanarAction::~IfcStructuralPlanarAction
          (IfcStructuralPlanarAction *this)

{
  undefined1 *puVar1;
  IfcStructuralActivity *this_00;
  long *plVar2;
  long lVar3;
  
  lVar3 = *(long *)(*(long *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.
                              super_IfcProduct.super_IfcObject + -0x18);
  this_00 = (IfcStructuralActivity *)
            (&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
              super_IfcObject.field_0x0 + lVar3);
  plVar2 = (long *)(&this->field_0x198 + lVar3);
  plVar2[-0x33] = 0x873650;
  plVar2[2] = 0x873768;
  plVar2[-0x22] = 0x873678;
  plVar2[-0x20] = 0x8736a0;
  plVar2[-0x19] = 0x8736c8;
  plVar2[-0x13] = 0x8736f0;
  plVar2[-0xc] = 0x873718;
  plVar2[-4] = 0x873740;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  *(undefined8 *)&(this_00->super_IfcProduct).super_IfcObject = 0x873918;
  *(undefined8 *)&this_00[1].super_IfcProduct.super_IfcObject.field_0x58 = 0x873a08;
  *(undefined8 *)&(this_00->super_IfcProduct).super_IfcObject.field_0x88 = 0x873940;
  (this_00->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x873968;
  *(undefined8 *)&(this_00->super_IfcProduct).super_IfcObject.field_0xd0 = 0x873990;
  *(undefined8 *)&(this_00->super_IfcProduct).field_0x100 = 0x8739b8;
  *(undefined8 *)&this_00->field_0x138 = 0x8739e0;
  puVar1 = &this_00[1].super_IfcProduct.super_IfcObject.field_0x8;
  if (*(undefined1 **)&this_00->field_0x148 != puVar1) {
    operator_delete(*(undefined1 **)&this_00->field_0x148,*(long *)puVar1 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity(this_00,&PTR_construction_vtable_24__00873788);
  operator_delete(this_00,0x1c0);
  return;
}

Assistant:

IfcStructuralPlanarAction() : Object("IfcStructuralPlanarAction") {}